

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

Cookie * Curl_cookie_add(Curl_easy *data,CookieInfo *c,_Bool httpheader,char *lineptr,char *domain,
                        char *path)

{
  char cVar1;
  char cVar2;
  Cookie **ppCVar3;
  bool bVar4;
  _Bool _Var5;
  _Bool _Var6;
  int iVar7;
  CURLofft CVar8;
  Cookie *pCVar9;
  size_t sVar10;
  char *pcVar11;
  size_t sVar12;
  char *pcVar13;
  time_t tVar14;
  char *pcVar15;
  long lVar16;
  uint uVar17;
  curl_off_t *num;
  Cookie *pCVar18;
  Cookie *pCVar19;
  Cookie *pCVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  byte bVar24;
  char *local_2060;
  undefined8 local_2040;
  char what [4096];
  char name [4096];
  
  bVar24 = 0;
  local_2040 = time((time_t *)0x0);
  pCVar9 = (Cookie *)(*Curl_ccalloc)(1,0x60);
  if (pCVar9 == (Cookie *)0x0) {
    return (Cookie *)0x0;
  }
  if (httpheader) {
    sVar10 = strlen(lineptr);
    if (5000 < sVar10) {
LAB_0010dcf8:
      (*Curl_cfree)(pCVar9);
      return (Cookie *)0x0;
    }
    pcVar11 = strchr(lineptr,0x3b);
    for (; (*lineptr == '\t' || (*lineptr == ' ')); lineptr = lineptr + 1) {
    }
    local_2060 = domain;
    bVar23 = false;
    do {
      what[0] = '\0';
      name._0_8_ = name._0_8_ & 0xffffffffffffff00;
      iVar7 = __isoc99_sscanf(lineptr,"%4095[^;\r\n=] =%4095[^;\r\n]",name,what);
      bVar4 = bVar23;
      if (0 < iVar7) {
        sVar10 = strlen(what);
        sVar12 = strlen(name);
        if (sVar12 + sVar10 < 0x1001 && (sVar10 < 0xfff && sVar12 < 0xfff)) {
          cVar2 = lineptr[sVar12];
          if ((sVar12 != 0) && ((lineptr[sVar12 - 1] == ' ' || (lineptr[sVar12 - 1] == '\t')))) {
            for (; ((cVar1 = lineptr[sVar12 - 1], cVar1 == ' ' ||
                    ((cVar1 != '\0' && (cVar1 == '\t')))) && (sVar12 != 0)); sVar12 = sVar12 - 1) {
            }
            name[sVar12] = '\0';
          }
          for (; (sVar10 != 0 && ((what[sVar10 - 1] == ' ' || (what[sVar10 - 1] == '\t'))));
              sVar10 = sVar10 - 1) {
            what[sVar10 - 1] = '\0';
          }
          for (pcVar15 = what; (*pcVar15 == ' ' || (*pcVar15 == '\t')); pcVar15 = pcVar15 + 1) {
          }
          if ((pCVar9->name == (char *)0x0) && (cVar2 == '=')) {
            pcVar13 = (*Curl_cstrdup)(name);
            pCVar9->name = pcVar13;
            pcVar13 = (*Curl_cstrdup)(pcVar15);
            pCVar9->value = pcVar13;
            if (pcVar13 != (char *)0x0 && pCVar9->name != (char *)0x0) {
LAB_0010deea:
              iVar7 = Curl_strcasecompare("path",name);
              if (iVar7 != 0) {
                (*Curl_cfree)(pCVar9->path);
                pcVar15 = (*Curl_cstrdup)(pcVar15);
                pCVar9->path = pcVar15;
                bVar4 = true;
                iVar7 = 4;
                if (pcVar15 != (char *)0x0) {
                  (*Curl_cfree)(pCVar9->spath);
                  pcVar15 = sanitize_cookie_path(pCVar9->path);
                  pCVar9->spath = pcVar15;
                  if (pcVar15 != (char *)0x0) goto LAB_0010e127;
                }
                goto LAB_0010e130;
              }
              iVar7 = Curl_strcasecompare("domain",name);
              if (iVar7 != 0) {
                pcVar15 = pcVar15 + (*pcVar15 == '.');
                pcVar13 = strchr(pcVar15,0x2e);
                if ((pcVar13 == (char *)0x0) &&
                   (iVar7 = Curl_strcasecompare("localhost",pcVar15), iVar7 == 0)) {
                  local_2060 = ":";
                }
                pcVar13 = local_2060;
                if (local_2060 == (char *)0x0) {
                  pcVar13 = pcVar15;
                }
                _Var5 = isip(pcVar13);
                if (local_2060 == (char *)0x0) {
LAB_0010e03a:
                  (*Curl_cfree)(pCVar9->domain);
                  pcVar15 = (*Curl_cstrdup)(pcVar15);
                  pCVar9->domain = pcVar15;
                  bVar21 = pcVar15 == (char *)0x0;
                  bVar22 = !bVar21;
                  if (bVar21) {
                    bVar4 = true;
                  }
                  if (_Var5 || bVar21) {
                    iVar7 = (uint)bVar21 << 2;
                  }
                  else {
                    pCVar9->tailmatch = true;
                    iVar7 = 0;
                    bVar22 = true;
                    bVar4 = bVar23;
                  }
                }
                else {
                  if (_Var5) {
                    iVar7 = strcmp(pcVar15,local_2060);
                    if (iVar7 == 0) goto LAB_0010e03a;
                    if (!_Var5) goto LAB_0010e029;
                  }
                  else {
LAB_0010e029:
                    _Var6 = tailmatch(pcVar15,local_2060);
                    if (_Var6) goto LAB_0010e03a;
                  }
                  iVar7 = 0;
                  Curl_infof(data,"skipped cookie with bad tailmatch domain: %s\n",pcVar15);
                  bVar22 = true;
                  bVar4 = true;
                }
                bVar23 = bVar4;
                if (!bVar22) goto LAB_0010e130;
                goto LAB_0010e127;
              }
              iVar7 = Curl_strcasecompare("version",name);
              if (iVar7 == 0) {
                iVar7 = Curl_strcasecompare("max-age",name);
                if (iVar7 == 0) {
                  iVar7 = Curl_strcasecompare("expires",name);
                  if (iVar7 == 0) goto LAB_0010e127;
                  (*Curl_cfree)(pCVar9->expirestr);
                  pcVar15 = (*Curl_cstrdup)(pcVar15);
                  pCVar9->expirestr = pcVar15;
                }
                else {
                  (*Curl_cfree)(pCVar9->maxage);
                  pcVar15 = (*Curl_cstrdup)(pcVar15);
                  pCVar9->maxage = pcVar15;
                }
              }
              else {
                (*Curl_cfree)(pCVar9->version);
                pcVar15 = (*Curl_cstrdup)(pcVar15);
                pCVar9->version = pcVar15;
              }
              if (pcVar15 != (char *)0x0) goto LAB_0010e127;
            }
            bVar4 = true;
            iVar7 = 4;
          }
          else {
            if (sVar10 != 0) goto LAB_0010deea;
            iVar7 = Curl_strcasecompare("secure",name);
            if (iVar7 == 0) {
              iVar7 = Curl_strcasecompare("httponly",name);
              if (iVar7 == 0) {
                if (cVar2 == '=') goto LAB_0010deea;
              }
              else {
                pCVar9->httponly = true;
              }
            }
            else {
              pCVar9->secure = true;
            }
LAB_0010e127:
            bVar4 = bVar23;
            iVar7 = 0;
          }
        }
        else {
          freecookie(pCVar9);
          Curl_infof(data,"oversized cookie dropped, name/val %d + %d bytes\n",sVar12,sVar10);
          iVar7 = 1;
        }
LAB_0010e130:
        if (iVar7 != 0) {
          if (iVar7 != 4) {
            return (Cookie *)0x0;
          }
          break;
        }
      }
      if ((pcVar11 == (char *)0x0) || (*pcVar11 == '\0')) {
        pcVar11 = (char *)0x0;
      }
      else {
        do {
          do {
            lineptr = pcVar11 + 1;
            cVar2 = *lineptr;
            pcVar11 = lineptr;
          } while (cVar2 == ' ');
        } while (cVar2 == '\t');
        pcVar11 = strchr(lineptr,0x3b);
        if (pcVar11 == (char *)0x0) {
          if (cVar2 == '\0') {
            pcVar11 = (char *)0x0;
          }
          else {
            sVar10 = strlen(lineptr);
            pcVar11 = lineptr + sVar10;
          }
        }
      }
      bVar23 = bVar4;
    } while (pcVar11 != (char *)0x0);
    pcVar11 = pCVar9->maxage;
    if (pcVar11 == (char *)0x0) {
      if (pCVar9->expirestr != (char *)0x0) {
        tVar14 = curl_getdate(pCVar9->expirestr,(time_t *)0x0);
        pCVar9->expires = tVar14;
        if (tVar14 == 0) {
          pCVar9->expires = 1;
        }
        else if (tVar14 < 0) {
          pCVar9->expires = 0;
        }
      }
    }
    else {
      num = &pCVar9->expires;
      CVar8 = curlx_strtoofft(pcVar11 + (*pcVar11 == '\"'),(char **)0x0,10,num);
      if (CVar8 == CURL_OFFT_OK) {
        if (0x7fffffffffffffff - local_2040 < *num) goto LAB_0010e4ff;
        *num = *num + local_2040;
      }
      else if (CVar8 == CURL_OFFT_FLOW) {
LAB_0010e4ff:
        *num = 0x7fffffffffffffff;
      }
    }
    bVar23 = bVar4;
    if (((!bVar4) && (pCVar9->domain == (char *)0x0)) && (local_2060 != (char *)0x0)) {
      pcVar11 = (*Curl_cstrdup)(local_2060);
      pCVar9->domain = pcVar11;
      bVar23 = true;
      if (pcVar11 != (char *)0x0) {
        bVar23 = bVar4;
      }
    }
    if (((!bVar23) && (path != (char *)0x0)) && (pCVar9->path == (char *)0x0)) {
      pcVar11 = strchr(path,0x3f);
      if (pcVar11 == (char *)0x0) {
        pcVar11 = strrchr(path,0x2f);
      }
      else {
        pcVar11 = (char *)Curl_memrchr(path,0x2f,(long)pcVar11 - (long)path);
      }
      if (pcVar11 != (char *)0x0) {
        pcVar15 = (char *)(*Curl_cmalloc)((size_t)(pcVar11 + (2 - (long)path)));
        pCVar9->path = pcVar15;
        if (pcVar15 == (char *)0x0) {
          bVar23 = true;
        }
        else {
          memcpy(pcVar15,path,(size_t)(pcVar11 + (1 - (long)path)));
          pCVar9->path[(long)(pcVar11 + (1 - (long)path))] = '\0';
          pcVar11 = sanitize_cookie_path(pCVar9->path);
          pCVar9->spath = pcVar11;
          bVar23 = pcVar11 == (char *)0x0;
        }
      }
    }
    if ((bVar23) || (pCVar9->name == (char *)0x0)) goto LAB_0010e69f;
  }
  else {
    name[0] = '\0';
    name[1] = '\0';
    name[2] = '\0';
    name[3] = '\0';
    name[4] = '\0';
    name[5] = '\0';
    name[6] = '\0';
    name[7] = '\0';
    iVar7 = strncmp(lineptr,"#HttpOnly_",10);
    if (iVar7 == 0) {
      lineptr = lineptr + 10;
      pCVar9->httponly = true;
    }
    if (*lineptr == '#') goto LAB_0010dcf8;
    pcVar11 = strchr(lineptr,0xd);
    if (pcVar11 != (char *)0x0) {
      *pcVar11 = '\0';
    }
    pcVar11 = strchr(lineptr,10);
    if (pcVar11 != (char *)0x0) {
      *pcVar11 = '\0';
    }
    pcVar11 = strtok_r(lineptr,"\t",(char **)name);
    if (pcVar11 == (char *)0x0) {
      bVar23 = false;
      uVar17 = 0;
    }
    else {
      uVar17 = 0;
      bVar23 = false;
      do {
        switch(uVar17) {
        case 0:
          pcVar11 = (*Curl_cstrdup)(pcVar11 + (*pcVar11 == '.'));
          pCVar9->domain = pcVar11;
          if (pcVar11 == (char *)0x0) {
            bVar23 = true;
          }
          uVar17 = 0;
          break;
        case 1:
          iVar7 = Curl_strcasecompare(pcVar11,"TRUE");
          pCVar9->tailmatch = iVar7 != 0;
          uVar17 = 1;
          break;
        case 2:
          iVar7 = strcmp("TRUE",pcVar11);
          if ((iVar7 == 0) || (iVar7 = strcmp("FALSE",pcVar11), iVar7 == 0)) {
            pcVar15 = (*Curl_cstrdup)("/");
            pCVar9->path = pcVar15;
            pcVar13 = (*Curl_cstrdup)("/");
            if (pcVar15 == (char *)0x0) {
              bVar23 = true;
            }
            pCVar9->spath = pcVar13;
            if (pcVar13 == (char *)0x0) {
              bVar23 = true;
            }
            goto switchD_0010e235_caseD_3;
          }
          pcVar11 = (*Curl_cstrdup)(pcVar11);
          pCVar9->path = pcVar11;
          uVar17 = 2;
          if (pcVar11 == (char *)0x0) {
            bVar23 = true;
          }
          else {
            pcVar11 = sanitize_cookie_path(pcVar11);
            pCVar9->spath = pcVar11;
            if (pcVar11 == (char *)0x0) {
              bVar23 = true;
            }
          }
          break;
        case 3:
switchD_0010e235_caseD_3:
          iVar7 = Curl_strcasecompare(pcVar11,"TRUE");
          pCVar9->secure = iVar7 != 0;
          uVar17 = 3;
          break;
        case 4:
          CVar8 = curlx_strtoofft(pcVar11,(char **)0x0,10,&pCVar9->expires);
          if (CVar8 != CURL_OFFT_OK) {
            bVar23 = true;
          }
          uVar17 = 4;
          break;
        case 5:
          pcVar11 = (*Curl_cstrdup)(pcVar11);
          pCVar9->name = pcVar11;
          if (pcVar11 == (char *)0x0) {
            bVar23 = true;
          }
          uVar17 = 5;
          break;
        case 6:
          pcVar11 = (*Curl_cstrdup)(pcVar11);
          pCVar9->value = pcVar11;
          if (pcVar11 == (char *)0x0) {
            bVar23 = true;
          }
          uVar17 = 6;
        }
        pcVar11 = strtok_r((char *)0x0,"\t",(char **)name);
        uVar17 = uVar17 + 1;
      } while ((pcVar11 != (char *)0x0) && (!bVar23));
    }
    if (uVar17 == 6) {
      pcVar11 = (*Curl_cstrdup)("");
      pCVar9->value = pcVar11;
      bVar4 = true;
      if (pcVar11 != (char *)0x0) {
        bVar4 = bVar23;
      }
      bVar23 = bVar4;
      uVar17 = pcVar11 == (char *)0x0 ^ 7;
    }
    if ((bVar23) || (uVar17 != 7)) goto LAB_0010e69f;
  }
  if ((c->running != false) || ((c->newsession != true || (pCVar9->expires != 0)))) {
    pCVar9->livecookie = c->running;
    remove_expired(c);
    bVar4 = false;
    bVar23 = false;
    if (c->cookies == (Cookie *)0x0) {
      pCVar19 = (Cookie *)0x0;
      pCVar20 = pCVar9;
    }
    else {
      pCVar18 = c->cookies;
      do {
        pCVar20 = pCVar18;
        iVar7 = Curl_strcasecompare(pCVar20->name,pCVar9->name);
        if (iVar7 != 0) {
          pcVar11 = pCVar20->domain;
          if (pcVar11 == (char *)0x0) {
LAB_0010e5e0:
            bVar22 = pCVar9->domain == (char *)0x0;
LAB_0010e5e5:
            bVar23 = bVar4;
            if (bVar22) {
              bVar4 = true;
              bVar23 = true;
            }
          }
          else if (pCVar9->domain == (char *)0x0) {
            if (pcVar11 == (char *)0x0) goto LAB_0010e5e0;
          }
          else {
            iVar7 = Curl_strcasecompare(pcVar11,pCVar9->domain);
            if (iVar7 != 0) {
              bVar22 = pCVar20->tailmatch == pCVar9->tailmatch;
              goto LAB_0010e5e5;
            }
          }
          if (bVar23) {
            pcVar11 = pCVar20->spath;
            if (pcVar11 == (char *)0x0) {
LAB_0010e617:
              if (pCVar9->spath == (char *)0x0) {
                bVar4 = true;
                bVar23 = true;
              }
              else {
LAB_0010e61e:
                bVar4 = false;
                bVar23 = false;
              }
            }
            else {
              if (pCVar9->spath == (char *)0x0) {
                if (pcVar11 == (char *)0x0) goto LAB_0010e617;
                goto LAB_0010e61e;
              }
              iVar7 = Curl_strcasecompare(pcVar11,pCVar9->spath);
              bVar23 = iVar7 != 0;
              bVar4 = bVar23;
            }
          }
          if (bVar23) {
            if ((pCVar9->livecookie != false) || (pCVar20->livecookie != true)) {
              pCVar9->next = pCVar20->next;
              (*Curl_cfree)(pCVar20->name);
              (*Curl_cfree)(pCVar20->value);
              (*Curl_cfree)(pCVar20->domain);
              (*Curl_cfree)(pCVar20->path);
              (*Curl_cfree)(pCVar20->spath);
              (*Curl_cfree)(pCVar20->expirestr);
              (*Curl_cfree)(pCVar20->version);
              (*Curl_cfree)(pCVar20->maxage);
              pCVar18 = pCVar9;
              pCVar19 = pCVar20;
              for (lVar16 = 0xc; lVar16 != 0; lVar16 = lVar16 + -1) {
                pCVar19->next = pCVar18->next;
                pCVar18 = (Cookie *)((long)pCVar18 + (ulong)bVar24 * -0x10 + 8);
                pCVar19 = (Cookie *)((long)pCVar19 + (ulong)bVar24 * -0x10 + 8);
              }
              (*Curl_cfree)(pCVar9);
              pCVar9 = pCVar20;
              do {
                pCVar19 = pCVar9;
                pCVar9 = pCVar19->next;
              } while (pCVar19->next != (Cookie *)0x0);
              break;
            }
            goto LAB_0010e69f;
          }
        }
        ppCVar3 = &pCVar20->next;
        pCVar18 = *ppCVar3;
        pCVar19 = pCVar20;
        pCVar20 = pCVar9;
      } while (*ppCVar3 != (Cookie *)0x0);
    }
    if (c->running == true) {
      pcVar11 = "Added";
      if (bVar23) {
        pcVar11 = "Replaced";
      }
      Curl_infof(data,"%s cookie %s=\"%s\" for domain %s, path %s, expire %ld\n",pcVar11,
                 pCVar20->name,pCVar20->value,pCVar20->domain,pCVar20->path,pCVar20->expires);
    }
    if (!bVar23) {
      if (pCVar19 == (Cookie *)0x0) {
        pCVar19 = (Cookie *)c;
      }
      pCVar19->next = pCVar20;
      c->numcookies = c->numcookies + 1;
      return pCVar20;
    }
    return pCVar20;
  }
LAB_0010e69f:
  freecookie(pCVar9);
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *
Curl_cookie_add(struct Curl_easy *data,
                /* The 'data' pointer here may be NULL at times, and thus
                   must only be used very carefully for things that can deal
                   with data being NULL. Such as infof() and similar */

                struct CookieInfo *c,
                bool httpheader, /* TRUE if HTTP header-style line */
                char *lineptr,   /* first character of the line */
                const char *domain, /* default domain */
                const char *path)   /* full path used when this cookie is set,
                                       used to get default path for the cookie
                                       unless set */
{
  struct Cookie *clist;
  struct Cookie *co;
  struct Cookie *lastc = NULL;
  time_t now = time(NULL);
  bool replace_old = FALSE;
  bool badcookie = FALSE; /* cookies are good by default. mmmmm yummy */

#ifdef USE_LIBPSL
  const psl_ctx_t *psl;
#endif

#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif

  /* First, alloc and init a new struct for it */
  co = calloc(1, sizeof(struct Cookie));
  if(!co)
    return NULL; /* bail out if we're this low on memory */

  if(httpheader) {
    /* This line was read off a HTTP-header */
    char name[MAX_NAME];
    char what[MAX_NAME];
    const char *ptr;
    const char *semiptr;

    size_t linelength = strlen(lineptr);
    if(linelength > MAX_COOKIE_LINE) {
      /* discard overly long lines at once */
      free(co);
      return NULL;
    }

    semiptr = strchr(lineptr, ';'); /* first, find a semicolon */

    while(*lineptr && ISBLANK(*lineptr))
      lineptr++;

    ptr = lineptr;
    do {
      /* we have a <what>=<this> pair or a stand-alone word here */
      name[0] = what[0] = 0; /* init the buffers */
      if(1 <= sscanf(ptr, "%" MAX_NAME_TXT "[^;\r\n=] =%"
                     MAX_NAME_TXT "[^;\r\n]",
                     name, what)) {
        /* Use strstore() below to properly deal with received cookie
           headers that have the same string property set more than once,
           and then we use the last one. */
        const char *whatptr;
        bool done = FALSE;
        bool sep;
        size_t len = strlen(what);
        size_t nlen = strlen(name);
        const char *endofn = &ptr[ nlen ];

        if(nlen >= (MAX_NAME-1) || len >= (MAX_NAME-1) ||
           ((nlen + len) > MAX_NAME)) {
          /* too long individual name or contents, or too long combination of
             name + contents. Chrome and Firefox support 4095 or 4096 bytes
             combo. */
          freecookie(co);
          infof(data, "oversized cookie dropped, name/val %d + %d bytes\n",
                nlen, len);
          return NULL;
        }

        /* name ends with a '=' ? */
        sep = (*endofn == '=')?TRUE:FALSE;

        if(nlen) {
          endofn--; /* move to the last character */
          if(ISBLANK(*endofn)) {
            /* skip trailing spaces in name */
            while(*endofn && ISBLANK(*endofn) && nlen) {
              endofn--;
              nlen--;
            }
            name[nlen] = 0; /* new end of name */
          }
        }

        /* Strip off trailing whitespace from the 'what' */
        while(len && ISBLANK(what[len-1])) {
          what[len-1] = 0;
          len--;
        }

        /* Skip leading whitespace from the 'what' */
        whatptr = what;
        while(*whatptr && ISBLANK(*whatptr))
          whatptr++;

        if(!co->name && sep) {
          /* The very first name/value pair is the actual cookie name */
          co->name = strdup(name);
          co->value = strdup(whatptr);
          if(!co->name || !co->value) {
            badcookie = TRUE;
            break;
          }
        }
        else if(!len) {
          /* this was a "<name>=" with no content, and we must allow
             'secure' and 'httponly' specified this weirdly */
          done = TRUE;
          if(strcasecompare("secure", name))
            co->secure = TRUE;
          else if(strcasecompare("httponly", name))
            co->httponly = TRUE;
          else if(sep)
            /* there was a '=' so we're not done parsing this field */
            done = FALSE;
        }
        if(done)
          ;
        else if(strcasecompare("path", name)) {
          strstore(&co->path, whatptr);
          if(!co->path) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
          free(co->spath); /* if this is set again */
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
        }
        else if(strcasecompare("domain", name)) {
          bool is_ip;

          /* Now, we make sure that our host is within the given domain,
             or the given domain is not valid and thus cannot be set. */

          if('.' == whatptr[0])
            whatptr++; /* ignore preceding dot */

#ifndef USE_LIBPSL
          /*
           * Without PSL we don't know when the incoming cookie is set on a
           * TLD or otherwise "protected" suffix. To reduce risk, we require a
           * dot OR the exact host name being "localhost".
           */
          {
            const char *dotp;
            /* check for more dots */
            dotp = strchr(whatptr, '.');
            if(!dotp && !strcasecompare("localhost", whatptr))
              domain = ":";
          }
#endif

          is_ip = isip(domain ? domain : whatptr);

          if(!domain
             || (is_ip && !strcmp(whatptr, domain))
             || (!is_ip && tailmatch(whatptr, domain))) {
            strstore(&co->domain, whatptr);
            if(!co->domain) {
              badcookie = TRUE;
              break;
            }
            if(!is_ip)
              co->tailmatch = TRUE; /* we always do that if the domain name was
                                       given */
          }
          else {
            /* we did not get a tailmatch and then the attempted set domain
               is not a domain to which the current host belongs. Mark as
               bad. */
            badcookie = TRUE;
            infof(data, "skipped cookie with bad tailmatch domain: %s\n",
                  whatptr);
          }
        }
        else if(strcasecompare("version", name)) {
          strstore(&co->version, whatptr);
          if(!co->version) {
            badcookie = TRUE;
            break;
          }
        }
        else if(strcasecompare("max-age", name)) {
          /* Defined in RFC2109:

             Optional.  The Max-Age attribute defines the lifetime of the
             cookie, in seconds.  The delta-seconds value is a decimal non-
             negative integer.  After delta-seconds seconds elapse, the
             client should discard the cookie.  A value of zero means the
             cookie should be discarded immediately.

          */
          strstore(&co->maxage, whatptr);
          if(!co->maxage) {
            badcookie = TRUE;
            break;
          }
        }
        else if(strcasecompare("expires", name)) {
          strstore(&co->expirestr, whatptr);
          if(!co->expirestr) {
            badcookie = TRUE;
            break;
          }
        }
        /*
          else this is the second (or more) name we don't know
          about! */
      }
      else {
        /* this is an "illegal" <what>=<this> pair */
      }

      if(!semiptr || !*semiptr) {
        /* we already know there are no more cookies */
        semiptr = NULL;
        continue;
      }

      ptr = semiptr + 1;
      while(*ptr && ISBLANK(*ptr))
        ptr++;
      semiptr = strchr(ptr, ';'); /* now, find the next semicolon */

      if(!semiptr && *ptr)
        /* There are no more semicolons, but there's a final name=value pair
           coming up */
        semiptr = strchr(ptr, '\0');
    } while(semiptr);

    if(co->maxage) {
      CURLofft offt;
      offt = curlx_strtoofft((*co->maxage == '\"')?
                             &co->maxage[1]:&co->maxage[0], NULL, 10,
                             &co->expires);
      if(offt == CURL_OFFT_FLOW)
        /* overflow, used max value */
        co->expires = CURL_OFF_T_MAX;
      else if(!offt) {
        if(CURL_OFF_T_MAX - now < co->expires)
          /* would overflow */
          co->expires = CURL_OFF_T_MAX;
        else
          co->expires += now;
      }
    }
    else if(co->expirestr) {
      /* Note that if the date couldn't get parsed for whatever reason,
         the cookie will be treated as a session cookie */
      co->expires = curl_getdate(co->expirestr, NULL);

      /* Session cookies have expires set to 0 so if we get that back
         from the date parser let's add a second to make it a
         non-session cookie */
      if(co->expires == 0)
        co->expires = 1;
      else if(co->expires < 0)
        co->expires = 0;
    }

    if(!badcookie && !co->domain) {
      if(domain) {
        /* no domain was given in the header line, set the default */
        co->domain = strdup(domain);
        if(!co->domain)
          badcookie = TRUE;
      }
    }

    if(!badcookie && !co->path && path) {
      /* No path was given in the header line, set the default.
         Note that the passed-in path to this function MAY have a '?' and
         following part that MUST not be stored as part of the path. */
      char *queryp = strchr(path, '?');

      /* queryp is where the interesting part of the path ends, so now we
         want to the find the last */
      char *endslash;
      if(!queryp)
        endslash = strrchr(path, '/');
      else
        endslash = memrchr(path, '/', (size_t)(queryp - path));
      if(endslash) {
        size_t pathlen = (size_t)(endslash-path + 1); /* include end slash */
        co->path = malloc(pathlen + 1); /* one extra for the zero byte */
        if(co->path) {
          memcpy(co->path, path, pathlen);
          co->path[pathlen] = 0; /* zero terminate */
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath)
            badcookie = TRUE; /* out of memory bad */
        }
        else
          badcookie = TRUE;
      }
    }

    if(badcookie || !co->name) {
      /* we didn't get a cookie name or a bad one,
         this is an illegal line, bail out */
      freecookie(co);
      return NULL;
    }

  }
  else {
    /* This line is NOT a HTTP header style line, we do offer support for
       reading the odd netscape cookies-file format here */
    char *ptr;
    char *firstptr;
    char *tok_buf = NULL;
    int fields;

    /* IE introduced HTTP-only cookies to prevent XSS attacks. Cookies
       marked with httpOnly after the domain name are not accessible
       from javascripts, but since curl does not operate at javascript
       level, we include them anyway. In Firefox's cookie files, these
       lines are preceded with #HttpOnly_ and then everything is
       as usual, so we skip 10 characters of the line..
    */
    if(strncmp(lineptr, "#HttpOnly_", 10) == 0) {
      lineptr += 10;
      co->httponly = TRUE;
    }

    if(lineptr[0]=='#') {
      /* don't even try the comments */
      free(co);
      return NULL;
    }
    /* strip off the possible end-of-line characters */
    ptr = strchr(lineptr, '\r');
    if(ptr)
      *ptr = 0; /* clear it */
    ptr = strchr(lineptr, '\n');
    if(ptr)
      *ptr = 0; /* clear it */

    firstptr = strtok_r(lineptr, "\t", &tok_buf); /* tokenize it on the TAB */

    /* Now loop through the fields and init the struct we already have
       allocated */
    for(ptr = firstptr, fields = 0; ptr && !badcookie;
        ptr = strtok_r(NULL, "\t", &tok_buf), fields++) {
      switch(fields) {
      case 0:
        if(ptr[0]=='.') /* skip preceding dots */
          ptr++;
        co->domain = strdup(ptr);
        if(!co->domain)
          badcookie = TRUE;
        break;
      case 1:
        /* This field got its explanation on the 23rd of May 2001 by
           Andr�s Garc�a:

           flag: A TRUE/FALSE value indicating if all machines within a given
           domain can access the variable. This value is set automatically by
           the browser, depending on the value you set for the domain.

           As far as I can see, it is set to true when the cookie says
           .domain.com and to false when the domain is complete www.domain.com
        */
        co->tailmatch = strcasecompare(ptr, "TRUE")?TRUE:FALSE;
        break;
      case 2:
        /* It turns out, that sometimes the file format allows the path
           field to remain not filled in, we try to detect this and work
           around it! Andr�s Garc�a made us aware of this... */
        if(strcmp("TRUE", ptr) && strcmp("FALSE", ptr)) {
          /* only if the path doesn't look like a boolean option! */
          co->path = strdup(ptr);
          if(!co->path)
            badcookie = TRUE;
          else {
            co->spath = sanitize_cookie_path(co->path);
            if(!co->spath) {
              badcookie = TRUE; /* out of memory bad */
            }
          }
          break;
        }
        /* this doesn't look like a path, make one up! */
        co->path = strdup("/");
        if(!co->path)
          badcookie = TRUE;
        co->spath = strdup("/");
        if(!co->spath)
          badcookie = TRUE;
        fields++; /* add a field and fall down to secure */
        /* FALLTHROUGH */
      case 3:
        co->secure = strcasecompare(ptr, "TRUE")?TRUE:FALSE;
        break;
      case 4:
        if(curlx_strtoofft(ptr, NULL, 10, &co->expires))
          badcookie = TRUE;
        break;
      case 5:
        co->name = strdup(ptr);
        if(!co->name)
          badcookie = TRUE;
        break;
      case 6:
        co->value = strdup(ptr);
        if(!co->value)
          badcookie = TRUE;
        break;
      }
    }
    if(6 == fields) {
      /* we got a cookie with blank contents, fix it */
      co->value = strdup("");
      if(!co->value)
        badcookie = TRUE;
      else
        fields++;
    }

    if(!badcookie && (7 != fields))
      /* we did not find the sufficient number of fields */
      badcookie = TRUE;

    if(badcookie) {
      freecookie(co);
      return NULL;
    }

  }

  if(!c->running &&    /* read from a file */
     c->newsession &&  /* clean session cookies */
     !co->expires) {   /* this is a session cookie since it doesn't expire! */
    freecookie(co);
    return NULL;
  }

  co->livecookie = c->running;

  /* now, we have parsed the incoming line, we must now check if this
     superceeds an already existing cookie, which it may if the previous have
     the same domain and path as this */

  /* at first, remove expired cookies */
  remove_expired(c);

#ifdef USE_LIBPSL
  /* Check if the domain is a Public Suffix and if yes, ignore the cookie.
     This needs a libpsl compiled with builtin data. */
  if(domain && co->domain && !isip(co->domain)) {
    psl = psl_builtin();
    if(psl && !psl_is_cookie_domain_acceptable(psl, domain, co->domain)) {
      infof(data,
            "cookie '%s' dropped, domain '%s' must not set cookies for '%s'\n",
            co->name, domain, co->domain);
      freecookie(co);
      return NULL;
    }
  }
#endif

  clist = c->cookies;
  replace_old = FALSE;
  while(clist) {
    if(strcasecompare(clist->name, co->name)) {
      /* the names are identical */

      if(clist->domain && co->domain) {
        if(strcasecompare(clist->domain, co->domain) &&
          (clist->tailmatch == co->tailmatch))
          /* The domains are identical */
          replace_old = TRUE;
      }
      else if(!clist->domain && !co->domain)
        replace_old = TRUE;

      if(replace_old) {
        /* the domains were identical */

        if(clist->spath && co->spath) {
          if(strcasecompare(clist->spath, co->spath)) {
            replace_old = TRUE;
          }
          else
            replace_old = FALSE;
        }
        else if(!clist->spath && !co->spath)
          replace_old = TRUE;
        else
          replace_old = FALSE;

      }

      if(replace_old && !co->livecookie && clist->livecookie) {
        /* Both cookies matched fine, except that the already present
           cookie is "live", which means it was set from a header, while
           the new one isn't "live" and thus only read from a file. We let
           live cookies stay alive */

        /* Free the newcomer and get out of here! */
        freecookie(co);
        return NULL;
      }

      if(replace_old) {
        co->next = clist->next; /* get the next-pointer first */

        /* then free all the old pointers */
        free(clist->name);
        free(clist->value);
        free(clist->domain);
        free(clist->path);
        free(clist->spath);
        free(clist->expirestr);
        free(clist->version);
        free(clist->maxage);

        *clist = *co;  /* then store all the new data */

        free(co);   /* free the newly alloced memory */
        co = clist; /* point to the previous struct instead */

        /* We have replaced a cookie, now skip the rest of the list but
           make sure the 'lastc' pointer is properly set */
        do {
          lastc = clist;
          clist = clist->next;
        } while(clist);
        break;
      }
    }
    lastc = clist;
    clist = clist->next;
  }

  if(c->running)
    /* Only show this when NOT reading the cookies from a file */
    infof(data, "%s cookie %s=\"%s\" for domain %s, path %s, "
          "expire %" CURL_FORMAT_CURL_OFF_T "\n",
          replace_old?"Replaced":"Added", co->name, co->value,
          co->domain, co->path, co->expires);

  if(!replace_old) {
    /* then make the last item point on this new one */
    if(lastc)
      lastc->next = co;
    else
      c->cookies = co;
    c->numcookies++; /* one more cookie in the jar */
  }

  return co;
}